

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor,
          bool immutable)

{
  string local_48;
  
  anon_unknown_0::StripPackageName
            (&local_48,*(string **)(descriptor + 8),
             *(FileDescriptor **)(*(long *)(*(long *)(descriptor + 0x10) + 8) + 8));
  GetClassFullName(__return_storage_ptr__,this,&local_48,*(FileDescriptor **)(descriptor + 0x10),
                   immutable,
                   *(bool *)(*(long *)(*(FileDescriptor **)(descriptor + 0x10) + 0xa0) + 0xa0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetClassName(const Descriptor* descriptor,
                                       bool immutable) {
  return GetClassFullName(ClassNameWithoutPackage(descriptor, immutable),
                          descriptor->file(), immutable,
                          MultipleJavaFiles(descriptor->file(), immutable));
}